

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::FillPrefixesCMakeEnvironment(cmFindPackageCommand *this)

{
  undefined8 uVar1;
  cmAlphaNum local_2c8;
  cmAlphaNum local_298;
  string local_268;
  cmAlphaNum local_248;
  cmAlphaNum local_218;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  cmAlphaNum local_178;
  cmAlphaNum local_148;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  string local_70;
  size_t local_40;
  size_t debugOffset;
  string debugBuffer;
  cmSearchPath *paths;
  cmFindPackageCommand *this_local;
  
  debugBuffer.field_2._8_8_ =
       std::
       map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
       ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                    &cmFindCommon::PathLabel::CMakeEnvironment);
  std::__cxx11::string::string((string *)&debugOffset);
  local_40 = 0;
  cmSearchPath::AddEnvPath((cmSearchPath *)debugBuffer.field_2._8_8_,&this->Variable);
  if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_a0,"Env variable ");
    cmAlphaNum::cmAlphaNum(&local_d0,&this->Variable);
    cmStrCat<char[43]>(&local_70,&local_a0,&local_d0,(char (*) [43])0xc297f2);
    std::__cxx11::string::operator=((string *)&debugOffset,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    local_40 = anon_unknown.dwarf_56d607::collectPathsForDebug
                         ((string *)&debugOffset,(cmSearchPath *)debugBuffer.field_2._8_8_,0);
  }
  uVar1 = debugBuffer.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"CMAKE_PREFIX_PATH",&local_f1);
  cmSearchPath::AddEnvPath((cmSearchPath *)uVar1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_148,(string *)&debugOffset);
    cmAlphaNum::cmAlphaNum
              (&local_178,
               "CMAKE_PREFIX_PATH env variable [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n");
    cmStrCat<>(&local_118,&local_148,&local_178);
    std::__cxx11::string::operator=((string *)&debugOffset,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    local_40 = anon_unknown.dwarf_56d607::collectPathsForDebug
                         ((string *)&debugOffset,(cmSearchPath *)debugBuffer.field_2._8_8_,local_40)
    ;
  }
  uVar1 = debugBuffer.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"CMAKE_FRAMEWORK_PATH",&local_199);
  cmSearchPath::AddEnvPath((cmSearchPath *)uVar1,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  uVar1 = debugBuffer.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"CMAKE_APPBUNDLE_PATH",&local_1c1);
  cmSearchPath::AddEnvPath((cmSearchPath *)uVar1,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_218,(string *)&debugOffset);
    cmAlphaNum::cmAlphaNum
              (&local_248,
               "CMAKE_FRAMEWORK_PATH and CMAKE_APPBUNDLE_PATH env variables [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n"
              );
    cmStrCat<>(&local_1e8,&local_218,&local_248);
    std::__cxx11::string::operator=((string *)&debugOffset,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    anon_unknown.dwarf_56d607::collectPathsForDebug
              ((string *)&debugOffset,(cmSearchPath *)debugBuffer.field_2._8_8_,local_40);
    cmAlphaNum::cmAlphaNum(&local_298,&this->DebugBuffer);
    cmAlphaNum::cmAlphaNum(&local_2c8,(string *)&debugOffset);
    cmStrCat<>(&local_268,&local_298,&local_2c8);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
  }
  std::__cxx11::string::~string((string *)&debugOffset);
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeEnvironment()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeEnvironment];
  std::string debugBuffer;
  std::size_t debugOffset = 0;

  // Check the environment variable with the same name as the cache
  // entry.
  paths.AddEnvPath(this->Variable);
  if (this->DebugMode) {
    debugBuffer = cmStrCat("Env variable ", this->Variable,
                           " [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n");
    debugOffset = collectPathsForDebug(debugBuffer, paths);
  }

  // And now the general CMake environment variables
  paths.AddEnvPath("CMAKE_PREFIX_PATH");
  if (this->DebugMode) {
    debugBuffer = cmStrCat(debugBuffer,
                           "CMAKE_PREFIX_PATH env variable "
                           "[CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n");
    debugOffset = collectPathsForDebug(debugBuffer, paths, debugOffset);
  }

  paths.AddEnvPath("CMAKE_FRAMEWORK_PATH");
  paths.AddEnvPath("CMAKE_APPBUNDLE_PATH");
  if (this->DebugMode) {
    debugBuffer =
      cmStrCat(debugBuffer,
               "CMAKE_FRAMEWORK_PATH and CMAKE_APPBUNDLE_PATH env "
               "variables [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n");
    collectPathsForDebug(debugBuffer, paths, debugOffset);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}